

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O2

Mutex * __thiscall absl::lts_20240722::flags_internal::FlagImpl::DataGuard(FlagImpl *this)

{
  FlagImpl *local_20;
  code *local_18;
  undefined8 local_10;
  
  local_18 = Init;
  local_10 = 0;
  local_20 = this;
  call_once<void(absl::lts_20240722::flags_internal::FlagImpl::*)(),absl::lts_20240722::flags_internal::FlagImpl*>
            (&this->init_control_,(offset_in_FlagImpl_to_subr *)&local_18,&local_20);
  return (Mutex *)this->data_guard_;
}

Assistant:

absl::Mutex* FlagImpl::DataGuard() const {
  absl::call_once(const_cast<FlagImpl*>(this)->init_control_, &FlagImpl::Init,
                  const_cast<FlagImpl*>(this));

  // data_guard_ is initialized inside Init.
  return reinterpret_cast<absl::Mutex*>(&data_guard_);
}